

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O2

void __thiscall wabt::interp::Istream::EmitInternal<v128>(Istream *this,v128 val)

{
  EmitAt<v128>(this,*(int *)&(this->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,val);
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}